

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scattering.cpp
# Opt level: O2

string * __thiscall
pbrt::FresnelDielectric::ToString_abi_cxx11_(string *__return_storage_ptr__,FresnelDielectric *this)

{
  char **in_R8;
  char *local_10;
  
  local_10 = "false";
  if (this[4] != (FresnelDielectric)0x0) {
    local_10 = "true";
  }
  StringPrintf<float_const&,char_const*>
            (__return_storage_ptr__,(pbrt *)"[ FrenselDielectric eta: %f opaque: %s ]",(char *)this,
             (float *)&local_10,in_R8);
  return __return_storage_ptr__;
}

Assistant:

std::string FresnelDielectric::ToString() const {
    return StringPrintf("[ FrenselDielectric eta: %f opaque: %s ]", eta,
                        opaque ? "true" : "false");
}